

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene_lights.cxx
# Opt level: O3

void __thiscall xray_re::xr_light_object::load(xr_light_object *this,xr_reader *r)

{
  ushort uVar1;
  uint32_t *puVar2;
  uint8_t *puVar3;
  float *pfVar4;
  long lVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  uint uVar8;
  size_t sVar9;
  uint16_t version;
  d3d_light light;
  ushort local_9a;
  d3d_light local_98;
  
  sVar9 = xr_reader::r_raw_chunk(r,0xb411,&local_9a,2);
  if (sVar9 == 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene_lights.cxx"
                  ,0x24,"virtual void xray_re::xr_light_object::load(xr_reader &)");
  }
  if ((local_9a & 0xfffe) != 0x10) {
    __assert_fail("version == LIGHT_VERSION_16 || version == LIGHT_VERSION",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene_lights.cxx"
                  ,0x25,"virtual void xray_re::xr_light_object::load(xr_reader &)");
  }
  xr_custom_object::load(&this->super_xr_custom_object,r);
  sVar9 = xr_reader::find_chunk(r,0xb442);
  if (sVar9 == 0) {
    sVar9 = xr_reader::find_chunk(r,0xb435);
    if (sVar9 == 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene_lights.cxx"
                    ,0x41,"virtual void xray_re::xr_light_object::load(xr_reader &)");
    }
    d3d_light::load(&local_98,r);
    *(uint32_t *)&(this->super_xr_custom_object).field_0x6c = local_98.type;
    (this->m_color).r = local_98.diffuse.r;
    (this->m_color).g = local_98.diffuse.g;
    (this->m_color).b = local_98.diffuse.b;
    (this->m_color).a = local_98.diffuse.a;
    *(undefined8 *)&(this->super_xr_custom_object).m_position.field_0 =
         local_98.position.field_0._0_8_;
    (this->super_xr_custom_object).m_position.field_0.field_0.z =
         local_98.position.field_0.field_0.z;
    this->m_range = local_98.range;
    this->m_attenuation_constant = local_98.attenuation0;
    this->m_attenuation_linear = local_98.attenuation1;
    this->m_attenuation_quadratic = local_98.attenuation2;
    this->m_cone_angle = local_98.phi;
    sVar9 = xr_reader::r_raw_chunk(r,0xb425,&this->m_brightness,4);
    if (sVar9 == 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene_lights.cxx"
                    ,0x3f,"virtual void xray_re::xr_light_object::load(xr_reader &)");
    }
  }
  else {
    puVar2 = (r->field_2).m_p_u32;
    (r->field_2).m_p = (uint8_t *)(puVar2 + 1);
    *(uint32_t *)&(this->super_xr_custom_object).field_0x6c = *puVar2;
    uVar6 = *(undefined8 *)(r->field_2).m_p;
    uVar7 = *(undefined8 *)((r->field_2).m_p + 8);
    (this->m_color).r = (float)(int)uVar6;
    (this->m_color).g = (float)(int)((ulong)uVar6 >> 0x20);
    (this->m_color).b = (float)(int)uVar7;
    (this->m_color).a = (float)(int)((ulong)uVar7 >> 0x20);
    puVar3 = (r->field_2).m_p;
    (r->field_2).m_p = puVar3 + 0x14;
    this->m_brightness = *(float *)(puVar3 + 0x10);
    pfVar4 = (float *)(r->field_2).m_p_u32;
    (r->field_2).m_p = (uint8_t *)(pfVar4 + 1);
    this->m_range = *pfVar4;
    pfVar4 = (float *)(r->field_2).m_p_u32;
    (r->field_2).m_p = (uint8_t *)(pfVar4 + 1);
    this->m_attenuation_constant = *pfVar4;
    pfVar4 = (float *)(r->field_2).m_p_u32;
    (r->field_2).m_p = (uint8_t *)(pfVar4 + 1);
    this->m_attenuation_linear = *pfVar4;
    pfVar4 = (float *)(r->field_2).m_p_u32;
    (r->field_2).m_p = (uint8_t *)(pfVar4 + 1);
    this->m_attenuation_quadratic = *pfVar4;
    pfVar4 = (float *)(r->field_2).m_p_u32;
    (r->field_2).m_p = (uint8_t *)(pfVar4 + 1);
    this->m_cone_angle = *pfVar4;
    pfVar4 = (float *)(r->field_2).m_p_u32;
    (r->field_2).m_p = (uint8_t *)(pfVar4 + 1);
    this->m_unknown = *pfVar4;
  }
  sVar9 = xr_reader::r_raw_chunk(r,0xb436,&this->m_use_in_d3d,4);
  if (sVar9 == 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene_lights.cxx"
                  ,0x44,"virtual void xray_re::xr_light_object::load(xr_reader &)");
  }
  if (local_9a == 0x10) {
    sVar9 = xr_reader::r_raw_chunk(r,0xb437,&(this->super_xr_custom_object).m_rotation,0xc);
    if (sVar9 == 0) {
      *(undefined8 *)&(this->super_xr_custom_object).m_rotation.field_0 = 0;
      (this->super_xr_custom_object).m_rotation.field_0.field_0.z = 0.0;
    }
  }
  puVar2 = &this->m_flags;
  xr_reader::r_raw_chunk(r,0xb413,puVar2,4);
  xr_reader::r_raw_chunk(r,0xb441,&this->m_control,4);
  if (*(int *)&(this->super_xr_custom_object).field_0x6c != 3) {
    sVar9 = xr_reader::find_chunk(r,0xb438);
    if (sVar9 != 0) {
      xr_reader::r_sz(r,&this->m_animation);
    }
    sVar9 = xr_reader::find_chunk(r,0xb439);
    if (sVar9 != 0) {
      xr_reader::r_sz(r,&this->m_texture);
    }
    sVar9 = xr_reader::find_chunk(r,0xb440);
    if (sVar9 == 0) {
      uVar8 = *puVar2 & 0xffffffef;
    }
    else {
      puVar3 = (r->field_2).m_p;
      (r->field_2).m_p = puVar3 + 1;
      (this->m_shape).type = *puVar3;
      uVar6 = *(undefined8 *)(r->field_2).m_p;
      uVar7 = *(undefined8 *)((r->field_2).m_p + 8);
      (this->m_shape).fixme.x = (float)(int)uVar6;
      (this->m_shape).fixme.y = (float)(int)((ulong)uVar6 >> 0x20);
      (this->m_shape).fixme.z = (float)(int)uVar7;
      (this->m_shape).fixme.w = (float)(int)((ulong)uVar7 >> 0x20);
      puVar3 = (r->field_2).m_p;
      (r->field_2).m_p = puVar3 + 0x12;
      uVar1 = *(ushort *)(puVar3 + 0x10);
      std::vector<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>::reserve
                (&this->m_vertices,(ulong)uVar1);
      lVar5 = (ulong)uVar1 * 0xc;
      std::vector<xray_re::_vector3<float>,std::allocator<xray_re::_vector3<float>>>::
      _M_assign_aux<xray_re::_vector3<float>const*>
                ((vector<xray_re::_vector3<float>,std::allocator<xray_re::_vector3<float>>> *)
                 &this->m_vertices,puVar3 + 0x12,puVar3 + lVar5 + 0x12);
      puVar3 = (r->field_2).m_p;
      (r->field_2).m_p = puVar3 + lVar5;
      if (r->m_end < puVar3 + lVar5) {
        __assert_fail("m_p <= m_end",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_reader.h"
                      ,0x7c,"void xray_re::xr_reader::advance(size_t)");
      }
      uVar8 = *puVar2 | 0x10;
    }
    *puVar2 = uVar8;
    return;
  }
  __assert_fail("m_type != D3D_LIGHT_DIRECTIONAL",
                "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene_lights.cxx"
                ,0x4b,"virtual void xray_re::xr_light_object::load(xr_reader &)");
}

Assistant:

void xr_light_object::load(xr_reader& r)
{
	uint16_t version;
	if (!r.r_chunk<uint16_t>(LIGHT_CHUNK_VERSION, version))
		xr_not_expected();
	xr_assert(version == LIGHT_VERSION_16 || version == LIGHT_VERSION);
	xr_custom_object::load(r);
	if (r.find_chunk(LIGHT_CHUNK_PARAMS)) {
		m_type = r.r_u32();
		r.r<fcolor>(m_color);
		m_brightness = r.r_float();
		m_range = r.r_float();
		m_attenuation_constant = r.r_float();
		m_attenuation_linear = r.r_float();
		m_attenuation_quadratic = r.r_float();
		m_cone_angle = r.r_float();
		m_unknown = r.r_float();
		r.debug_find_chunk();
	} else if (r.find_chunk(LIGHT_CHUNK_D3D_PARAMS)) {
		d3d_light light;
		light.load(r);
		m_type = light.type;
		m_color = light.diffuse;
		co_position().set(light.position);
		m_range = light.range;
		m_attenuation_constant = light.attenuation0;
		m_attenuation_linear = light.attenuation1;
		m_attenuation_quadratic = light.attenuation2;
		m_cone_angle = light.phi;
		r.debug_find_chunk();
		if (!r.r_chunk<float>(LIGHT_CHUNK_BRIGHTNESS, m_brightness))
			xr_not_expected();
	} else {
		xr_not_expected();
	}
	if (!r.r_chunk<uint32_t>(LIGHT_CHUNK_USE_IN_D3D, m_use_in_d3d))
		xr_not_expected();
	if (version == LIGHT_VERSION_16 &&
			!r.r_chunk<fvector3>(LIGHT_CHUNK_ROTATION, co_rotation())) {
		co_rotation().set();
	}
	r.r_chunk<uint32_t>(LIGHT_CHUNK_FLAGS, m_flags);
	r.r_chunk<uint32_t>(LIGHT_CHUNK_CONTROL, m_control);
	xr_assert(m_type != D3D_LIGHT_DIRECTIONAL);	// FIXME
	if (r.find_chunk(LIGHT_CHUNK_ANIMATION)) {
		r.r_sz(m_animation);
		r.debug_find_chunk();
	}
	if (r.find_chunk(LIGHT_CHUNK_TEXTURE)) {
		r.r_sz(m_texture);
		r.debug_find_chunk();
	}
	if (r.find_chunk(LIGHT_CHUNK_FUZZY_DATA)) {
		m_shape.type = r.r_u8();
		r.r<fvector4>(m_shape.fixme);
		r.r_seq(r.r_u16(), m_vertices);
		r.debug_find_chunk();
		m_flags |= LIGHT_FLAG_FUZZY;
	} else {
		m_flags &= ~LIGHT_FLAG_FUZZY;
	}
}